

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O1

void relational_suite::compare_u32string_with_wstring_literal(void)

{
  bool bVar1;
  undefined1 local_4a;
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  local_49 = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_wchar_t[6],_void>
             ::less(&local_48,L"delta");
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") < L\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f16,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  if (local_48.storage.current == '\0') {
    local_49 = true;
  }
  else {
    bVar1 = trial::dynamic::detail::
            operator_overloader<wchar_t[6],_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
            ::less((wchar_t (*) [6])L"delta",&local_48);
    local_49 = !bVar1;
  }
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") <= L\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f17,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  if (local_48.storage.current == '\0') {
    local_49 = false;
  }
  else {
    local_49 = trial::dynamic::detail::
               operator_overloader<wchar_t[6],_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
               ::less((wchar_t (*) [6])L"delta",&local_48);
  }
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") > L\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f18,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_wchar_t[6],_void>
          ::less(&local_48,L"delta");
  local_49 = !bVar1;
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") >= L\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f19,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  local_49 = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_wchar_t[5],_void>
             ::less(&local_48,L"zulu");
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") < L\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f1b,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  if (local_48.storage.current == '\0') {
    local_49 = true;
  }
  else {
    bVar1 = trial::dynamic::detail::
            operator_overloader<wchar_t[5],_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
            ::less((wchar_t (*) [5])L"zulu",&local_48);
    local_49 = !bVar1;
  }
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") <= L\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f1c,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  if (local_48.storage.current == '\0') {
    local_49 = false;
  }
  else {
    local_49 = trial::dynamic::detail::
               operator_overloader<wchar_t[5],_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
               ::less((wchar_t (*) [5])L"zulu",&local_48);
  }
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") > L\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f1d,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"delta");
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_wchar_t[5],_void>
          ::less(&local_48,L"zulu");
  local_49 = !bVar1;
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(U\"delta\") >= L\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f1e,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"zulu");
  local_49 = trial::dynamic::detail::
             operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_wchar_t[6],_void>
             ::less(&local_48,L"delta");
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"zulu\") < L\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f20,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"zulu");
  if (local_48.storage.current == '\0') {
    local_49 = true;
  }
  else {
    bVar1 = trial::dynamic::detail::
            operator_overloader<wchar_t[6],_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
            ::less((wchar_t (*) [6])L"delta",&local_48);
    local_49 = !bVar1;
  }
  local_4a = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"zulu\") <= L\"delta\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f21,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"zulu");
  if (local_48.storage.current == '\0') {
    local_49 = false;
  }
  else {
    local_49 = trial::dynamic::detail::
               operator_overloader<wchar_t[6],_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
               ::less((wchar_t (*) [6])L"delta",&local_48);
  }
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"zulu\") > L\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f22,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"zulu");
  bVar1 = trial::dynamic::detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_wchar_t[6],_void>
          ::less(&local_48,L"delta");
  local_49 = !bVar1;
  local_4a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(u\"zulu\") >= L\"delta\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f23,"void relational_suite::compare_u32string_with_wstring_literal()",&local_49,
             &local_4a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48);
  return;
}

Assistant:

void compare_u32string_with_wstring_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") < L"delta", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") <= L"delta", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") > L"delta", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") >= L"delta", true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") < L"zulu", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") <= L"zulu", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") > L"zulu", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(U"delta") >= L"zulu", true);

    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"zulu") < L"delta", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"zulu") <= L"delta", false);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"zulu") > L"delta", true);
    TRIAL_PROTOCOL_TEST_EQUAL(variable(u"zulu") >= L"delta", true);
}